

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CommonCore::receive(CommonCore *this,InterfaceHandle destination)

{
  string_view message;
  FederateStates FVar1;
  FederateState *pFVar2;
  undefined8 uVar3;
  InterfaceHandle in_EDX;
  Message *in_RDI;
  CommonCore *unaff_retaddr;
  InterfaceHandle in_stack_0000000c;
  FederateState *fed;
  nullptr_t in_stack_ffffffffffffffa8;
  _Head_base<0UL,_helics::Message_*,_false> __str;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  FederateState *in_stack_ffffffffffffffd0;
  
  __str._M_head_impl = in_RDI;
  pFVar2 = getHandleFederate(unaff_retaddr,in_stack_0000000c);
  if (pFVar2 == (FederateState *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)__str._M_head_impl);
    message._M_str = (char *)in_stack_ffffffffffffffd0;
    message._M_len = in_stack_ffffffffffffffc8;
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               message);
    __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  FVar1 = FederateState::getState((FederateState *)0x557a95);
  if (FVar1 == EXECUTING) {
    FederateState::receive(in_stack_ffffffffffffffd0,in_EDX);
  }
  else {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
               in_stack_ffffffffffffffa8);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)__str._M_head_impl;
}

Assistant:

std::unique_ptr<Message> CommonCore::receive(InterfaceHandle destination)
{
    auto* fed = getHandleFederate(destination);
    if (fed == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (fed->getState() != FederateStates::EXECUTING) {
        return nullptr;
    }

    return fed->receive(destination);
}